

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

StuntDouble * __thiscall OpenMD::SimInfo::getIOIndexToIntegrableObject(SimInfo *this,int index)

{
  size_type sVar1;
  reference ppSVar2;
  int in_ESI;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  value_type local_8;
  
  sVar1 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                    ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                     &in_RDI[0x32].
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (in_ESI < (int)sVar1) {
    ppSVar2 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::at
                        (in_RDI,in_stack_ffffffffffffffd8);
    local_8 = *ppSVar2;
  }
  else {
    snprintf(painCave.errMsg,2000,
             "SimInfo::getIOIndexToIntegrableObject Error: Integrable Object\n\tindex exceeds number of known objects!\n"
            );
    painCave.isFatal = 1;
    simError();
    local_8 = (value_type)0x0;
  }
  return local_8;
}

Assistant:

StuntDouble* SimInfo::getIOIndexToIntegrableObject(int index) {
    if (index >= int(IOIndexToIntegrableObject.size())) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SimInfo::getIOIndexToIntegrableObject Error: Integrable Object\n"
          "\tindex exceeds number of known objects!\n");
      painCave.isFatal = 1;
      simError();
      return NULL;
    } else
      return IOIndexToIntegrableObject.at(index);
  }